

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::QTextStreamPrivate(QTextStreamPrivate *this,QTextStream *q_ptr)

{
  Params *in_RSI;
  long in_RDI;
  Params *this_00;
  
  this_00 = in_RSI;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags((QFlags<QIODeviceBase::OpenModeFlag> *)0x13da24);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  QStringEncoder::QStringEncoder((QStringEncoder *)0x13da38);
  QStringDecoder::QStringDecoder((QStringDecoder *)0x13da45);
  QStringDecoder::QStringDecoder((QStringDecoder *)0x13da55);
  QString::QString((QString *)0x13da65);
  QString::QString((QString *)0x13da75);
  *(undefined8 *)(in_RDI + 0x100) = 0;
  Params::Params(this_00);
  QLocale::c((void *)(in_RDI + 0x130),in_RSI);
  *(undefined1 *)(in_RDI + 0x14a) = 0;
  *(undefined1 *)(in_RDI + 0x14b) = 0;
  *(Params **)(in_RDI + 0x138) = this_00;
  reset((QTextStreamPrivate *)q_ptr);
  return;
}

Assistant:

QTextStreamPrivate::QTextStreamPrivate(QTextStream *q_ptr)
    : readConverterSavedStateOffset(0),
      locale(QLocale::c())
{
    this->q_ptr = q_ptr;
    reset();
}